

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_test.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  buddy_allocator *this;
  ostream *poVar4;
  void *pvVar5;
  size_t allocated_size;
  ulong uVar6;
  size_t __size;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  vector<void_*,_std::allocator<void_*>_> ptrs;
  void *tmp;
  int local_5c;
  void **local_58;
  iterator iStack_50;
  void **local_48;
  void *local_38;
  
  this = (buddy_allocator *)malloc(0xa00000);
  cppcms::impl::buddy_allocator::buddy_allocator(this,0xa00000);
  cppcms::impl::buddy_allocator::test_free(this);
  uVar7 = 0;
  local_5c = 0;
  do {
    iVar8 = (int)uVar7;
    if ((int)(uVar7 / 1000) * 1000 == iVar8) {
      *(undefined8 *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) = 5;
      poVar4 = std::ostream::_M_insert<double>((double)iVar8 / 1000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\b\b\b\b\b\b",6);
      std::ostream::flush();
    }
    iVar2 = rand();
    uVar7 = (ulong)(long)iVar2 % 100;
    iVar2 = rand();
    uVar9 = (ulong)(uint)(1 << ((char)iVar2 + (char)(iVar2 / 0x16) * -0x16 & 0x1fU));
    iVar2 = rand();
    if (memory[uVar7] != (void *)0x0) {
      cppcms::impl::buddy_allocator::free_page(this,(page *)((long)memory[uVar7] + -0x10));
      memory[uVar7] = (void *)0x0;
      check_all();
    }
    __size = (uVar9 - 1 & (long)iVar2) + uVar9;
    pvVar5 = cppcms::impl::buddy_allocator::malloc(this,__size);
    memory[uVar7] = pvVar5;
    if (pvVar5 == (void *)0x0) {
      check_all();
      local_5c = local_5c + 1;
    }
    else {
      sizes[uVar7] = __size;
      uVar3 = rand();
      vals[uVar7] = (char)uVar3;
      if (__size != 0) {
        memset(memory[uVar7],uVar3 & 0xff,__size);
      }
      check_all();
    }
    cppcms::impl::buddy_allocator::test_consistent(this,memory,100);
    uVar7 = (ulong)(iVar8 + 100U);
  } while (iVar8 + 100U != 100000);
  lVar10 = 0;
  do {
    if (*(long *)((long)memory + lVar10) != 0) {
      cppcms::impl::buddy_allocator::free_page
                (this,(page *)(*(long *)((long)memory + lVar10) + -0x10));
      *(undefined8 *)((long)memory + lVar10) = 0;
      check_all();
    }
    cppcms::impl::buddy_allocator::test_consistent(this,memory,100);
    lVar10 = lVar10 + 8;
  } while (lVar10 != 800);
  cppcms::impl::buddy_allocator::test_free(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n malloc fail to all ",0x15);
  poVar4 = std::ostream::_M_insert<double>(((double)local_5c / 1000.0) * 100.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  bVar1 = true;
  do {
    uVar7 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Object size ",0xc);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      local_58 = (void **)0x0;
      iStack_50._M_current = (void **)0x0;
      local_48 = (void **)0x0;
      local_38 = (void *)0x0;
      while (local_38 = cppcms::impl::buddy_allocator::malloc(this,uVar7), local_38 != (void *)0x0)
      {
        if (iStack_50._M_current == local_48) {
          std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                    ((vector<void*,std::allocator<void*>> *)&local_58,iStack_50,&local_38);
        }
        else {
          *iStack_50._M_current = local_38;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        allocated_size = (long)iStack_50._M_current - (long)local_58 >> 3;
        if ((allocated_size * 100) % (0xa00000 / (uVar7 & 0xffffffff)) == 0) {
          cppcms::impl::buddy_allocator::test_consistent(this,local_58,allocated_size);
        }
      }
      if (local_58 == iStack_50._M_current) {
        if (local_58 != (void **)0x0) {
          operator_delete(local_58);
        }
        break;
      }
      cppcms::impl::buddy_allocator::test_consistent
                (this,local_58,(long)iStack_50._M_current - (long)local_58 >> 3);
      if (bVar1) {
        if (iStack_50._M_current != local_58) {
          uVar9 = 0;
          do {
            if (local_58[uVar9] != (void *)0x0) {
              cppcms::impl::buddy_allocator::free_page(this,(page *)((long)local_58[uVar9] + -0x10))
              ;
            }
            local_58[uVar9] = (void *)0x0;
            uVar6 = (long)iStack_50._M_current - (long)local_58 >> 3;
            if ((uVar9 * 100) % uVar6 == 0) {
              cppcms::impl::buddy_allocator::test_consistent(this,local_58 + uVar9,uVar6 - uVar9);
              uVar6 = (long)iStack_50._M_current - (long)local_58 >> 3;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar6);
        }
      }
      else {
        uVar3 = (int)((ulong)((long)iStack_50._M_current - (long)local_58) >> 3) - 1;
        if (-1 < (int)uVar3) {
          uVar6 = (ulong)uVar3 * 100;
          uVar9 = (ulong)uVar3;
          do {
            if (local_58[uVar9] != (void *)0x0) {
              cppcms::impl::buddy_allocator::free_page(this,(page *)((long)local_58[uVar9] + -0x10))
              ;
            }
            local_58[uVar9] = (void *)0x0;
            if (uVar6 % (ulong)((long)iStack_50._M_current - (long)local_58 >> 3) == 0) {
              cppcms::impl::buddy_allocator::test_consistent(this,local_58,uVar9);
            }
            uVar6 = uVar6 - 100;
            bVar11 = 0 < (long)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar11);
        }
      }
      cppcms::impl::buddy_allocator::test_free(this);
      if (local_58 != (void **)0x0) {
        operator_delete(local_58);
      }
      bVar11 = uVar7 < 0x500000;
      uVar7 = uVar7 * 2;
    } while (bVar11);
    bVar11 = !bVar1;
    bVar1 = false;
    if (bVar11) {
      free(this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok\n",3);
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	size_t memory_size = 1024*1024*10ULL;
	void *ptr = malloc(memory_size);
	cppcms::impl::buddy_allocator *buddy=new(ptr) cppcms::impl::buddy_allocator(memory_size);
	try{
		int fail = 0;

		int limit = 1000;

		buddy->test_free();
		for(int i=0;i<limit;i++) {
			if(i*100 % limit==0)
				std::cout << std::setw(5) << i*100.0 / limit << "%"<< "\b\b\b\b\b\b" << std::flush;
			size_t pos = rand() % objects;
			size_t size = (1 << (rand() % 22));
			size += rand() % size;
			if(memory[pos]) {
				buddy->free(memory[pos]);
				memory[pos] = 0;
				check_all();
			}
			if((memory[pos]=buddy->malloc(size))==0) {
				check_all();
				fail++;
			}
			else {
				sizes[pos] = size;
				char c=rand();
				vals[pos] = c;
				char *s = static_cast<char *>(memory[pos]);
				for(size_t j=0;j<size;j++)
					s[j] = c;
				check_all();
			}
			buddy->test_consistent(memory,objects);
		}
		for(size_t i=0;i<objects;i++) {
			if(memory[i]) {
				buddy->free(memory[i]);
				memory[i]=0;
				check_all();
			}
			buddy->test_consistent(memory,objects);
		}

		buddy->test_free();
		std::cout << "\n malloc fail to all " << double(fail) / limit * 100 << std::endl;
		for(int dir=0;dir<=1;dir++) {
			for(size_t i=1;i<memory_size;i*=2) {
				std::cout << "Object size " << i << std::endl;
				std::vector<void *> ptrs;
				void *tmp=0;
				size_t exp =  memory_size / i;
				while((tmp=buddy->malloc(i))!=0) {
					ptrs.push_back(tmp);
					if(ptrs.size() * 100 % exp==0)
						buddy->test_consistent(&ptrs[0],ptrs.size());
				}
				if(ptrs.empty())
					break;
				buddy->test_consistent(&ptrs[0],ptrs.size());
				if(dir == 0) {
					for(size_t i=0;i<ptrs.size();i++) {
						buddy->free(ptrs[i]);
						ptrs[i]=0;
						if(i*100 % ptrs.size() == 0)
							buddy->test_consistent(&ptrs[0]+i,ptrs.size()-i);
					}
				}
				else {
					for(int i=ptrs.size()-1;i>=0;i--) {
						buddy->free(ptrs[i]);
						ptrs[i]=0;
						if(i*100 % ptrs.size() == 0)
							buddy->test_consistent(&ptrs[0],i);
					}
				}
				buddy->test_free();
			}
		}

	}
	catch(std::exception const &e) {
		std::cerr << "Fail " << e.what() << std::endl;
		return 1;
	}
	buddy->~buddy_allocator();
	free(ptr);
	std::cout << "Ok\n";
}